

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
 __thiscall
spvtools::opt::analysis::TypeManager::GetTypeAndPointerType
          (TypeManager *this,uint32_t id,StorageClass sc)

{
  __uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
  extraout_RDX;
  tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  extraout_RDX_00;
  __uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  _Var1;
  undefined4 in_register_00000034;
  pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
  pVar2;
  unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  local_38;
  unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  local_30;
  unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  local_28;
  Type *type;
  StorageClass sc_local;
  uint32_t id_local;
  TypeManager *this_local;
  
  _sc_local = (TypeManager *)CONCAT44(in_register_00000034,id);
  type._4_4_ = sc;
  this_local = this;
  local_28._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
        )GetType(_sc_local,sc);
  if ((tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
       )local_28._M_t.
        super___uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
        .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl ==
      (_Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>)0x0) {
    std::
    unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>
    ::unique_ptr<std::default_delete<spvtools::opt::analysis::Pointer>,void>
              ((unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>
                *)&local_38);
    std::
    make_pair<spvtools::opt::analysis::Type*&,std::unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>>
              ((Type **)this,&local_28);
    std::
    unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    ::~unique_ptr(&local_38);
    _Var1._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
         (tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
          )(tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
            )extraout_RDX_00.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  }
  else {
    MakeUnique<spvtools::opt::analysis::Pointer,spvtools::opt::analysis::Type*&,spv::StorageClass&>
              ((spvtools *)&local_30,(Type **)&local_28,(StorageClass *)&type);
    std::
    make_pair<spvtools::opt::analysis::Type*&,std::unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>>
              ((Type **)this,&local_28);
    std::
    unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    ::~unique_ptr(&local_30);
    _Var1._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
         (tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
          )(tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
            )extraout_RDX.
             super___uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  }
  pVar2.second._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
          )_Var1._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  pVar2.first = (Type *)this;
  return pVar2;
}

Assistant:

std::pair<Type*, std::unique_ptr<Pointer>> TypeManager::GetTypeAndPointerType(
    uint32_t id, spv::StorageClass sc) const {
  Type* type = GetType(id);
  if (type) {
    return std::make_pair(type, MakeUnique<Pointer>(type, sc));
  } else {
    return std::make_pair(type, std::unique_ptr<Pointer>());
  }
}